

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O2

void __thiscall
cnn::Conv1DNarrow::backward_impl
          (Conv1DNarrow *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Scalar SVar1;
  Scalar SVar2;
  pointer ppTVar3;
  Tensor *pTVar4;
  undefined1 auVar5 [16];
  Scalar *pSVar6;
  ulong uVar7;
  uint k;
  ulong uVar8;
  ulong uVar9;
  uint j;
  ulong uVar10;
  uint i_1;
  ulong uVar11;
  ulong uVar12;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> di;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> d;
  
  if (i < 2) {
    ppTVar3 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pTVar4 = ppTVar3[1];
    uVar12 = 1;
    uVar9 = 1;
    if (1 < (this->super_Node).dim.nd) {
      uVar9 = (ulong)(this->super_Node).dim.d[1];
    }
    uVar7 = (ulong)((*ppTVar3)->d).d[0];
    if (1 < (pTVar4->d).nd) {
      uVar12 = (ulong)(pTVar4->d).d[1];
    }
    Tensor::operator*(&d,dEdf);
    Tensor::operator*(&di,dEdxi);
    if (i == 0) {
      Tensor::operator*(&x,(xs->
                           super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                           )._M_impl.super__Vector_impl_data._M_start[1]);
      for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
        for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
          uVar8 = 0;
          while (uVar12 != uVar8) {
            pSVar6 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&x,uVar11,uVar8);
            SVar1 = *pSVar6;
            pSVar6 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&d,uVar11,uVar10);
            SVar2 = *pSVar6;
            pSVar6 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&di,uVar11,(ulong)(uint)((int)uVar10 + (int)uVar8));
            uVar8 = uVar8 + 1;
            auVar5 = vfmadd213ss_fma(ZEXT416((uint)SVar2),ZEXT416((uint)SVar1),
                                     ZEXT416((uint)*pSVar6));
            *pSVar6 = auVar5._0_4_;
          }
        }
      }
    }
    else {
      Tensor::operator*(&x,*(xs->
                            super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                            )._M_impl.super__Vector_impl_data._M_start);
      for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
        for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
          uVar8 = 0;
          while (uVar12 != uVar8) {
            pSVar6 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&x,uVar11,(ulong)(uint)((int)uVar10 + (int)uVar8));
            SVar1 = *pSVar6;
            pSVar6 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&d,uVar11,uVar10);
            SVar2 = *pSVar6;
            pSVar6 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&di,uVar11,uVar8);
            uVar8 = uVar8 + 1;
            auVar5 = vfmadd213ss_fma(ZEXT416((uint)SVar2),ZEXT416((uint)SVar1),
                                     ZEXT416((uint)*pSVar6));
            *pSVar6 = auVar5._0_4_;
          }
        }
      }
    }
    return;
  }
  __assert_fail("i < 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/conv.cc"
                ,0x9e,
                "virtual void cnn::Conv1DNarrow::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
               );
}

Assistant:

void Conv1DNarrow::backward_impl(const vector<const Tensor*>& xs,
                            const Tensor& fx,
                            const Tensor& dEdf,
                            unsigned i,
                            Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Conv1DNarrow::backward not implemented for CUDA");
#else
  // TODO this is a bad implementation- rewrite to use unsupported Eigen tensor library
  assert(i < 2);
  const unsigned rows = xs[0]->d.rows();
  const unsigned ycols = dim.cols();
  const unsigned fcols = xs[1]->d.cols();
  auto d = *dEdf;
  auto di = *dEdxi;
  if (i == 0) { // derivative wrt input x
    auto f = **xs[1];
    for (unsigned i = 0; i < rows; ++i) {
      for (unsigned j = 0; j < ycols; ++j) {
        for (unsigned k = 0; k < fcols; ++k)
          di(i, j + k) += f(i, k) * d(i, j);
      }
    }
  } else { // derivative wrt filter f
    auto x = **xs[0];
    for (unsigned i = 0; i < rows; ++i) {
      for (unsigned j = 0; j < ycols; ++j) {
        for (unsigned k = 0; k < fcols; ++k)
          di(i, k) += x(i, j + k) * d(i, j);
      }
    }
  }
#endif
}